

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::LightHandle::PDF_Le
          (LightHandle *this,Interaction *intr,Vector3f *w,Float *pdfPos,Float *pdfDir)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (2 < uVar2) {
      if ((uVar2 & 6) == 2) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
                 ,0x187,"Shouldn\'t be called for non-area lights");
      }
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
               ,0x1bb,"Shouldn\'t be called for non-area lights");
    }
    if (uVar2 == 2) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
               ,0x14a,"Shouldn\'t be called for non-area lights");
    }
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
             ,0x118,"Shouldn\'t be called for non-area lights");
  }
  if (uVar2 - 4 < 3) {
    if (uVar2 - 4 == 2) {
      DiffuseAreaLight::PDF_Le((DiffuseAreaLight *)(uVar1 & 0xffffffffffff),intr,w,pdfPos,pdfDir);
      return;
    }
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
             ,0x331,"Shouldn\'t be called for non-area lights");
  }
  uVar3 = uVar2 - 6;
  if (uVar3 < 2) {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
             ,0x247,"Shouldn\'t be called for non-area lights");
  }
  if (uVar3 == 2) {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
             ,0x26f,"Shouldn\'t be called for non-area lights");
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.h"
           ,0x2ce,"Shouldn\'t be called for non-area lights");
}

Assistant:

void LightHandle::PDF_Le(const Interaction &intr, Vector3f &w, Float *pdfPos,
                         Float *pdfDir) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_Le(intr, w, pdfPos, pdfDir); };
    return Dispatch(pdf);
}